

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::handle&,pybind11::handle&>
          (pybind11 *this,handle *args_,handle *args__1)

{
  PyTypeObject *pPVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  handle *this_00;
  cast_error *this_01;
  PyObject **ppPVar6;
  handle local_130;
  iterator local_128;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range2;
  int counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  undefined1 *local_c0;
  undefined1 local_b8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  size_t i;
  PyObject *local_68;
  handle local_50;
  PyObject *local_48;
  pybind11 *local_40;
  undefined1 local_38 [8];
  array<pybind11::object,_2UL> args;
  size_t size;
  handle *args__local_1;
  handle *args__local;
  tuple *result;
  
  args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x2;
  local_40 = (pybind11 *)local_38;
  handle::handle(&local_50,(PyObject *)0x0);
  local_48 = (PyObject *)
             detail::pyobject_caster<pybind11::handle>::cast(args_,automatic_reference,local_50);
  reinterpret_steal<pybind11::object>((pybind11 *)local_38,(handle)local_48);
  local_40 = (pybind11 *)&args;
  handle::handle((handle *)&i,(PyObject *)0x0);
  local_68 = (PyObject *)
             detail::pyobject_caster<pybind11::handle>::cast(args__1,automatic_reference,(handle)i);
  reinterpret_steal<pybind11::object>((pybind11 *)&args,(handle)local_68);
  argtypes._56_8_ = 0;
  while( true ) {
    uVar2 = argtypes._56_8_;
    sVar5 = std::array<pybind11::object,_2UL>::size((array<pybind11::object,_2UL> *)local_38);
    if (sVar5 <= (ulong)uVar2) {
      __range2._6_1_ = 0;
      tuple::tuple((tuple *)this,2);
      __range2._0_4_ = 0;
      __begin0 = (iterator)local_38;
      __end0 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)__begin0);
      arg_value = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)__begin0);
      while( true ) {
        if (__end0 == arg_value) {
          __range2._6_1_ = 1;
          std::array<pybind11::object,_2UL>::~array((array<pybind11::object,_2UL> *)local_38);
          return (object)(object)this;
        }
        local_128 = __end0;
        local_130 = object::release(__end0);
        ppPVar6 = handle::ptr(&local_130);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)this);
        iVar4 = PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar4 == 0) break;
        ppPVar6 = handle::ptr((handle *)this);
        (&(*ppPVar6)[1].ob_type)[(int)__range2] = pPVar1;
        __end0 = __end0 + 1;
        __range2._0_4_ = (int)__range2 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/cast.h"
                    ,0x6f0,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle &, pybind11::handle &>]"
                   );
    }
    this_00 = &std::array<pybind11::object,_2UL>::operator[]
                         ((array<pybind11::object,_2UL> *)local_38,argtypes._56_8_)->super_handle;
    bVar3 = handle::operator_cast_to_bool(this_00);
    if (!bVar3) break;
    argtypes._56_8_ = argtypes._56_8_ + 1;
  }
  local_c0 = local_b8;
  type_id<pybind11::handle&>();
  local_c0 = &argtypes.field_0x18;
  type_id<pybind11::handle&>();
  __range2._7_1_ = 1;
  this_01 = (cast_error *)__cxa_allocate_exception(0x10);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_b8,argtypes._56_8_);
  std::operator+((char *)&counter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "make_tuple(): unable to convert argument of type \'");
  std::operator+(local_e0,(char *)&counter);
  cast_error::runtime_error(this_01,local_e0);
  __range2._7_1_ = 0;
  __cxa_throw(this_01,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}